

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int match_attrs(char *a,size_t alen,char *b,size_t blen)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 0;
  if (alen == blen) {
    if (alen == 0) {
      return 1;
    }
    iVar2 = bcmp(a,b,alen);
    uVar1 = (uint)(iVar2 == 0);
  }
  return uVar1;
}

Assistant:

static int match_attrs(const char *a, size_t alen,
                       const char *b, size_t blen)
{
    /* if the lengths don't match, it's not a match */
    if (alen != blen)
        return FALSE;

    /* if both are empty strings, it's a match */
    if (alen == 0 && blen == 0)
        return TRUE;

    /* compare the strings */
    return memcmp(a, b, alen) == 0;
}